

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.c
# Opt level: O1

MUSTACHE_TEMPLATE *
mustache_compile(char *templ_data,size_t templ_size,MUSTACHE_PARSER *parser,void *parser_data,
                uint flags)

{
  char *pcVar1;
  byte bVar2;
  long lVar3;
  undefined1 auVar4 [16];
  uint8_t *puVar5;
  int iVar6;
  int iVar7;
  MUSTACHE_PARSER *pMVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  uint64_t num;
  ulong *data;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  size_t sVar16;
  MUSTACHE_BUFFER *pMVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  int *piVar21;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  bool bVar25;
  MUSTACHE_BUFFER insns;
  MUSTACHE_STACK jmp_pos_stack;
  MUSTACHE_BUFFER tags;
  char closer [32];
  char opener [32];
  int *local_190;
  int local_184;
  size_t local_170;
  MUSTACHE_BUFFER local_158;
  ulong local_138;
  undefined1 local_130 [8];
  long local_128;
  size_t local_120;
  size_t sStack_118;
  ulong local_110;
  ulong local_108;
  ulong local_f8;
  long local_f0;
  ulong local_e8;
  char *local_e0;
  MUSTACHE_BUFFER local_d8;
  MUSTACHE_BUFFER local_b8;
  MUSTACHE_BUFFER local_98;
  long local_80;
  char local_78 [32];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_158.data = (uint8_t *)0x0;
  local_158.n = 0;
  local_158.alloc = 0;
  local_d8.alloc = 0;
  local_d8.data = (uint8_t *)0x0;
  local_d8.n = 0;
  pMVar8 = &mustache_compile::default_parser;
  if (parser != (MUSTACHE_PARSER *)0x0) {
    pMVar8 = parser;
  }
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0x7b7b;
  uStack_50 = 0;
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0x18] = '\0';
  local_78[0x19] = '\0';
  local_78[0x1a] = '\0';
  local_78[0x1b] = '\0';
  local_78[0x1c] = '\0';
  local_78[0x1d] = '\0';
  local_78[0x1e] = '\0';
  local_78[0x1f] = '\0';
  local_78[0] = '}';
  local_78[1] = '}';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  uVar15 = 0;
  local_b8.alloc = 0;
  local_b8.data = (uint8_t *)0x0;
  local_b8.n = 0;
  if (templ_size != 0) {
    local_138 = CONCAT44(local_138._4_4_,0xb);
    local_120 = 0;
    sStack_118 = 0;
    iVar6 = mustache_buffer_insert(&local_b8,0,&local_138,0x38);
    if (iVar6 != 0) goto LAB_00108292;
  }
  local_138 = local_138 & 0xffffffff00000000;
  local_f8 = (ulong)local_130;
  local_f0 = local_128;
  local_e8 = 1;
  local_e0 = (char *)0x2;
  local_170 = 2;
  local_184 = 0;
  local_190 = (int *)0x1;
  uVar13 = local_110;
  sVar20 = local_120;
  uVar22 = 0;
  do {
    puVar5 = local_b8.data;
    if (templ_size <= uVar22) {
      local_e0 = (char *)local_b8.n;
      uVar22 = local_b8.n >> 3;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar22;
      local_98.data = (uint8_t *)0x0;
      local_98.n = 0;
      local_98.alloc = 0;
      if ((auVar4 * ZEXT816(0x2492492492492493) & (undefined1  [16])0xffffffff) !=
          (undefined1  [16])0x0) {
        lVar23 = 0;
        iVar6 = 0;
        goto LAB_00108086;
      }
      iVar6 = 0;
      goto LAB_001081de;
    }
    uVar12 = uVar22 + (long)local_e0;
    if (templ_size < uVar12) {
      bVar24 = false;
    }
    else {
      iVar6 = bcmp(templ_data + uVar22,&local_58,(size_t)local_e0);
      bVar24 = iVar6 == 0;
    }
    uVar18 = uVar22 + local_170;
    if (templ_size < uVar18) {
      bVar25 = false;
    }
    else {
      iVar6 = bcmp(templ_data + uVar22,local_78,local_170);
      bVar25 = iVar6 == 0;
    }
    if ((bool)(bVar24 & bVar25)) {
      bVar24 = (bool)(uVar15 == 0 & bVar24);
      bVar25 = (bool)(uVar15 != 0 & bVar25);
    }
    if (bVar24) {
      if ((uVar15 & 0xfffffffd) != 0) {
        (*pMVar8->parse_error)
                  (1,"Tag opener has no closer.",(uint)local_f8,(uint)local_f0,parser_data);
        local_184 = local_184 + 1;
        local_138 = local_138 & 0xffffffff00000000;
        uVar15 = 0;
      }
      local_130 = (undefined1  [8])local_e8;
      local_128 = (long)local_190;
      if (uVar12 < templ_size) {
        bVar2 = templ_data[uVar12];
        if (bVar2 < 0x3d) {
          if (bVar2 < 0x26) {
            if (bVar2 == 0x21) {
              local_138 = CONCAT44(local_138._4_4_,2);
              uVar12 = uVar12 + 1;
              uVar15 = 2;
            }
            else if (bVar2 == 0x23) {
              local_138 = CONCAT44(local_138._4_4_,6);
              uVar12 = uVar12 + 1;
              uVar15 = 6;
            }
            else {
LAB_00107ac7:
              local_138 = CONCAT44(local_138._4_4_,3);
              uVar15 = 3;
            }
          }
          else if (bVar2 == 0x26) {
            local_138 = CONCAT44(local_138._4_4_,5);
            uVar12 = uVar12 + 1;
            uVar15 = 5;
          }
          else {
            if (bVar2 != 0x2f) goto LAB_00107ac7;
            local_138 = CONCAT44(local_138._4_4_,8);
            uVar12 = uVar12 + 1;
            uVar15 = 8;
          }
        }
        else if (bVar2 < 0x5e) {
          if (bVar2 == 0x3d) {
            local_138 = CONCAT44(local_138._4_4_,1);
            uVar12 = uVar12 + 1;
            uVar15 = 1;
          }
          else {
            if (bVar2 != 0x3e) goto LAB_00107ac7;
            local_138 = CONCAT44(local_138._4_4_,10);
            uVar12 = uVar12 + 1;
            uVar15 = 10;
          }
        }
        else if (bVar2 == 0x5e) {
          local_138 = CONCAT44(local_138._4_4_,7);
          uVar12 = uVar12 + 1;
          uVar15 = 7;
        }
        else {
          if (bVar2 != 0x7b) goto LAB_00107ac7;
          local_138 = CONCAT44(local_138._4_4_,4);
          uVar12 = uVar12 + 1;
          uVar15 = 4;
        }
      }
      uVar13 = uVar12;
      if (uVar12 < templ_size) {
        do {
          uVar13 = uVar12;
          if ((0x20 < (ulong)(byte)templ_data[uVar12]) ||
             ((0x100001a00U >> ((ulong)(byte)templ_data[uVar12] & 0x3f) & 1) == 0)) break;
          uVar12 = uVar12 + 1;
          uVar13 = templ_size;
        } while (templ_size != uVar12);
      }
      local_f0 = (long)local_190;
      local_190 = (int *)(((long)local_190 - uVar22) + uVar13);
      bVar24 = true;
      local_f8 = local_e8;
      uVar18 = uVar13;
      sVar20 = uVar22;
      local_120 = uVar22;
      local_110 = uVar13;
    }
    else {
      if ((bool)(uVar15 == 0 & bVar25)) {
        (*pMVar8->parse_error)
                  (2,"Tag closer has no opener.",(uint)local_e8,(uint)local_190,parser_data);
        local_184 = local_184 + 1;
        uVar18 = uVar22 + 1;
        local_190 = (int *)((long)local_190 + 1);
      }
      else {
        if (bVar25) {
          local_190 = (int *)((long)local_190 + local_170);
          local_108 = uVar22;
          if (uVar15 == 1) {
            if ((((templ_data[uVar22 - 1] != '=') && (local_170 + uVar18 < templ_size)) &&
                (templ_data[uVar18] == '=')) &&
               (iVar6 = bcmp(templ_data + uVar18 + 1,local_78,local_170), iVar6 == 0)) {
              uVar22 = uVar22 + local_170 + 1;
              uVar18 = uVar18 + 1 + local_170;
              local_190 = (int *)((long)local_190 + 1 + local_170);
              local_108 = uVar22;
            }
            if (templ_data[uVar22 - 1] == '=') {
              if ((long)uVar13 < (long)uVar22) goto LAB_00107c1c;
            }
            else {
              (*pMVar8->parse_error)
                        (3,"Tag closer is incompatible with its opener.",(uint)local_e8,
                         (uint)local_190,parser_data);
              local_184 = local_184 + 1;
            }
          }
          else if (uVar15 == 4) {
            if (((long)uVar13 < (long)uVar22) && (templ_data[uVar22 - 1] == '}')) {
LAB_00107c1c:
              uVar22 = uVar22 - 1;
            }
            else {
              if (local_170 == 0) {
                bVar24 = true;
              }
              else {
                lVar23 = 0;
                do {
                  bVar24 = local_78[lVar23] == '}';
                  if (!bVar24) break;
                  bVar25 = local_170 - 1 != lVar23;
                  lVar23 = lVar23 + 1;
                } while (bVar25);
              }
              if (((uVar18 < templ_size) && (bVar24)) && (templ_data[uVar18] == '}')) {
                uVar18 = uVar18 + 1;
                local_190 = (int *)((long)local_190 + 1);
              }
              else {
                (*pMVar8->parse_error)
                          (3,"Tag closer is incompatible with its opener.",(uint)local_e8,
                           (uint)local_190,parser_data);
                local_184 = local_184 + 1;
              }
            }
          }
          uVar12 = uVar22;
          sStack_118 = uVar18;
          if ((uVar15 - 6 < 0xfffffffd) &&
             (((templ_size <= uVar18 || (templ_data[uVar18] == '\r')) ||
              (templ_data[uVar18] == '\n')))) {
            sVar9 = sVar20;
            if (0 < (long)sVar20) {
              do {
                if ((0x20 < (ulong)(byte)templ_data[sVar9 - 1]) ||
                   ((0x100001a00U >> ((ulong)(byte)templ_data[sVar9 - 1] & 0x3f) & 1) == 0))
                goto LAB_00107cbc;
                bVar24 = 1 < (long)sVar9;
                sVar9 = sVar9 - 1;
              } while (bVar24);
              sVar9 = 0;
            }
LAB_00107cbc:
            if (((sVar9 == 0) || (templ_data[sVar9 - 1] == '\r')) || (templ_data[sVar9 - 1] == '\n')
               ) {
              if ((uVar18 < templ_size) && (templ_data[uVar18] == '\r')) {
                sStack_118 = uVar18 + 1;
              }
              local_120 = sVar9;
              sVar20 = sVar9;
              if ((sStack_118 < templ_size) && (templ_data[sStack_118] == '\n')) {
                sStack_118 = sStack_118 + 1;
              }
            }
          }
          while ((((long)uVar13 < (long)uVar22 &&
                  (uVar12 = uVar22, (ulong)(byte)templ_data[uVar22 - 1] < 0x21)) &&
                 ((0x100001a00U >> ((ulong)(byte)templ_data[uVar22 - 1] & 0x3f) & 1) != 0))) {
            uVar22 = uVar22 - 1;
            uVar12 = uVar13;
          }
          local_108 = uVar12;
          if ((uVar15 != 2) && ((long)uVar22 <= (long)uVar13)) {
            (*pMVar8->parse_error)(4,"Tag has no name.",(uint)local_f8,(uint)local_f0,parser_data);
            local_184 = local_184 + 1;
          }
          if (uVar15 == 1) {
            pcVar1 = templ_data + uVar13;
            uVar14 = 0;
            uVar10 = uVar12 - uVar13;
            uVar22 = uVar14;
            if (uVar10 != 0) {
              do {
                uVar19 = (ulong)(byte)pcVar1[uVar14];
                if (uVar19 < 0x3e) {
                  uVar22 = uVar14;
                  if ((0x100001a00U >> (uVar19 & 0x3f) & 1) != 0) break;
                  if (uVar19 == 0x3d) goto LAB_00107dce;
                }
                uVar14 = uVar14 + 1;
                uVar22 = uVar10;
              } while (uVar10 != uVar14);
            }
            if (uVar22 - 0x21 < 0xffffffffffffffe0) {
LAB_00107dce:
              bVar24 = false;
            }
            else {
              uVar14 = uVar22;
              uVar19 = uVar22;
              if (uVar22 < uVar10) {
                do {
                  uVar14 = uVar19;
                  if ((0x20 < (ulong)(byte)pcVar1[uVar19]) ||
                     ((0x100001a00U >> ((ulong)(byte)pcVar1[uVar19] & 0x3f) & 1) == 0)) break;
                  uVar19 = uVar19 + 1;
                  uVar14 = uVar10;
                } while (uVar10 != uVar19);
              }
              if (uVar22 < uVar14) {
                uVar19 = uVar14;
                if (uVar14 < uVar10) {
                  uVar11 = uVar14 + uVar13;
                  do {
                    if (((ulong)(byte)templ_data[uVar11] < 0x21) &&
                       ((0x100001a00U >> ((ulong)(byte)templ_data[uVar11] & 0x3f) & 1) != 0))
                    goto LAB_00107dce;
                    uVar11 = uVar11 + 1;
                    uVar19 = uVar10;
                  } while (uVar12 != uVar11);
                }
                sVar16 = uVar19 - uVar14;
                if (uVar14 <= uVar19 && sVar16 != 0) {
                  if (uVar19 != uVar10 || 0x20 < (long)sVar16) goto LAB_00107dce;
                  local_e0 = pcVar1;
                  memcpy(&local_58,pcVar1,uVar22);
                  memcpy(local_78,local_e0 + uVar14,sVar16);
                  bVar24 = true;
                  local_170 = sVar16;
                  local_e0 = (char *)uVar22;
                  goto LAB_00107ebf;
                }
              }
              bVar24 = false;
            }
LAB_00107ebf:
            if (!bVar24) {
              (*pMVar8->parse_error)
                        (10,"Invalid specification of delimiters.",(uint)local_f8,(uint)local_f0,
                         parser_data);
              local_184 = local_184 + 1;
            }
            local_138 = CONCAT44(local_138._4_4_,2);
            uVar15 = 2;
          }
          if (uVar15 != 2) {
            pcVar1 = templ_data + uVar13;
            if ((uVar12 - uVar13 != 1) || (*pcVar1 != '.')) {
              if ((*pcVar1 == '.') || (templ_data[uVar12 - 1] == '.')) {
LAB_00107f37:
                (*pMVar8->parse_error)
                          (5,"Tag name is invalid.",(uint)local_f8,(uint)local_f0,parser_data);
                local_184 = local_184 + 1;
              }
              else if (uVar12 != uVar13) {
                uVar22 = 1;
                do {
                  uVar10 = (ulong)(byte)pcVar1[uVar22 - 1];
                  if (uVar10 < 0x2f) {
                    if (uVar10 == 0x2e) {
                      if ((uVar22 < uVar12 - uVar13) && (pcVar1[uVar22] == '.')) goto LAB_00107f37;
                    }
                    else if ((0x100001a00U >> (uVar10 & 0x3f) & 1) != 0) goto LAB_00107f37;
                  }
                  lVar23 = (uVar13 - uVar12) + uVar22;
                  uVar22 = uVar22 + 1;
                } while (lVar23 != 0);
              }
            }
          }
          iVar6 = mustache_buffer_insert(&local_b8,local_b8.n,&local_138,0x38);
          bVar24 = iVar6 == 0;
          if (bVar24) {
            local_138 = local_138 & 0xffffffff00000000;
            uVar15 = 0;
          }
          goto LAB_00107fa8;
        }
        if ((templ_data[uVar22] == '\r') || (templ_data[uVar22] == '\n')) {
          if ((uVar15 & 0xfffffffd) != 0) {
            (*pMVar8->parse_error)
                      (1,"Tag opener has no closer.",(uint)local_f8,(uint)local_f0,parser_data);
            local_184 = local_184 + 1;
            local_138 = local_138 & 0xffffffff00000000;
            uVar15 = 0;
          }
          uVar18 = (templ_data[uVar22] == '\r') + uVar22;
          if (uVar18 < templ_size) {
            uVar18 = uVar18 + (templ_data[uVar18] == '\n');
          }
          if ((uVar15 == 0) && (uVar18 < templ_size)) {
            local_138 = CONCAT44(local_138._4_4_,0xb);
            local_120 = uVar18;
            sStack_118 = uVar18;
            iVar6 = mustache_buffer_insert(&local_b8,local_b8.n,&local_138,0x38);
            sVar20 = uVar18;
            if (iVar6 != 0) {
              uVar15 = 0xb;
              bVar24 = false;
              goto LAB_00107fa8;
            }
            uVar15 = 0;
            local_138 = local_138 & 0xffffffff00000000;
          }
          local_e8 = local_e8 + 1;
          local_190 = (int *)0x1;
        }
        else {
          uVar18 = uVar22 + 1;
          local_190 = (int *)((long)local_190 + 1);
        }
      }
      bVar24 = true;
    }
LAB_00107fa8:
    uVar22 = uVar18;
  } while (bVar24);
LAB_00108292:
  free(local_b8.data);
  local_190 = (int *)0x0;
  bVar24 = false;
  goto LAB_001082aa;
switchD_00108341_caseD_0:
  local_130 = (undefined1  [8])((ulong)local_130 & 0xffffffffffffff);
  iVar6 = mustache_buffer_insert(&local_158,local_158.n,local_130 + 7,1);
  if (iVar6 == 0) {
    free(local_190);
    free(local_d8.data);
    return (MUSTACHE_TEMPLATE *)local_158.data;
  }
  goto LAB_0010868a;
LAB_00108086:
  do {
    if (*(int *)((long)puVar5 + lVar23) - 8U < 2) {
      if (local_98.n == 0) {
        (*pMVar8->parse_error)
                  (7,"Section-closing tag has no opener.",*(uint *)((long)puVar5 + lVar23 + 8),
                   *(uint *)((long)puVar5 + lVar23 + 0x10),parser_data);
        iVar6 = iVar6 + 1;
      }
      else {
        piVar21 = *(int **)(local_98.data + (local_98.n - 8));
        local_98.n = local_98.n - 8;
        sVar16 = *(long *)(piVar21 + 0xc) - *(long *)(piVar21 + 10);
        lVar3 = *(long *)((long)puVar5 + lVar23 + 0x28);
        if ((sVar16 != *(long *)((long)puVar5 + lVar23 + 0x30) - lVar3) ||
           (iVar7 = strncmp(templ_data + *(long *)(piVar21 + 10),templ_data + lVar3,sVar16),
           iVar7 != 0)) {
          (*pMVar8->parse_error)
                    (8,
                     "Name of section-closing tag does not match corresponding section-opening tag."
                     ,*(uint *)((long)puVar5 + lVar23 + 8),*(uint *)((long)puVar5 + lVar23 + 0x10),
                     parser_data);
          (*pMVar8->parse_error)
                    (9,"The section-opening is located here.",piVar21[2],piVar21[4],parser_data);
          iVar6 = iVar6 + 1;
        }
        if (*piVar21 == 7) {
          *(undefined4 *)((long)puVar5 + lVar23) = 9;
        }
      }
    }
    else if (*(int *)((long)puVar5 + lVar23) - 6U < 2) {
      local_80 = lVar23 + (long)puVar5;
      iVar7 = mustache_buffer_insert(&local_98,local_98.n,&local_80,8);
      if (iVar7 != 0) {
        free(local_98.data);
        goto LAB_00108292;
      }
    }
    lVar23 = lVar23 + 0x38;
  } while ((uVar22 / 7 & 0xffffffff) * 0x38 != lVar23);
LAB_001081de:
  puVar5 = local_98.data;
  sVar20 = local_98.n;
  if (local_98.n != 0) {
    do {
      (*pMVar8->parse_error)
                (6,"Section-opening tag has no closer.",
                 *(uint *)(*(long *)(puVar5 + (sVar20 - 8)) + 8),
                 *(uint *)(*(long *)(puVar5 + (sVar20 - 8)) + 0x10),parser_data);
      iVar6 = iVar6 + 1;
      sVar20 = sVar20 - 8;
    } while (sVar20 != 0);
    local_98.n = 0;
  }
  free(local_98.data);
  if (iVar6 != 0) goto LAB_00108292;
  local_138 = local_138 & 0xffffffff00000000;
  local_120 = templ_size;
  sStack_118 = templ_size;
  iVar6 = mustache_buffer_insert(&local_b8,(off_t)local_e0,&local_138,0x38);
  if (iVar6 != 0 || local_184 != 0) goto LAB_00108292;
  bVar24 = true;
  local_190 = (int *)local_b8.data;
LAB_001082aa:
  if (bVar24) {
    lVar23 = 0;
    piVar21 = local_190;
    do {
      if (lVar23 < *(long *)(piVar21 + 6)) {
        local_130[7] = 1;
        iVar6 = mustache_buffer_insert(&local_158,local_158.n,local_130 + 7,1);
        if (((iVar6 != 0) ||
            (iVar6 = mustache_buffer_insert_num
                               (&local_158,local_158.n,*(long *)(piVar21 + 6) - lVar23), iVar6 != 0)
            ) || (iVar6 = mustache_buffer_insert
                                    (&local_158,local_158.n,templ_data + lVar23,
                                     *(long *)(piVar21 + 6) - lVar23), iVar6 != 0)) break;
      }
      pMVar17 = &local_158;
      switch(*piVar21) {
      case 0:
        goto switchD_00108341_caseD_0;
      default:
        goto switchD_00108341_caseD_1;
      case 3:
      case 4:
      case 5:
        local_130[7] = 3;
        iVar6 = mustache_buffer_insert(&local_158,local_158.n,local_130 + 7,1);
        if ((iVar6 == 0) &&
           (iVar6 = mustache_compile_tagname
                              (&local_158,templ_data + *(long *)(piVar21 + 10),
                               *(long *)(piVar21 + 0xc) - *(long *)(piVar21 + 10)), iVar6 == 0)) {
          num = (ulong)(*piVar21 == 3) | 4;
          uVar22 = local_158.n;
          goto LAB_001084d2;
        }
        goto LAB_0010868a;
      case 6:
        local_130[7] = 2;
        iVar6 = mustache_buffer_insert(&local_158,local_158.n,local_130 + 7,1);
        if (iVar6 != 0) goto LAB_0010868a;
        local_138 = local_158.n;
        iVar6 = mustache_buffer_insert(&local_d8,local_d8.n,&local_138,8);
        if ((iVar6 != 0) ||
           (iVar6 = mustache_compile_tagname
                              (&local_158,templ_data + *(long *)(piVar21 + 10),
                               *(long *)(piVar21 + 0xc) - *(long *)(piVar21 + 10)), iVar6 != 0))
        goto LAB_0010868a;
        local_130[7] = 6;
        iVar6 = mustache_buffer_insert(&local_158,local_158.n,local_130 + 7,1);
        if (iVar6 != 0) goto LAB_0010868a;
        local_138 = local_158.n;
        sVar20 = 8;
        pMVar17 = &local_d8;
        data = &local_138;
        sVar9 = local_d8.n;
        break;
      case 7:
        local_130[7] = 2;
        iVar6 = mustache_buffer_insert(&local_158,local_158.n,local_130 + 7,1);
        if (iVar6 == 0) {
          local_138 = local_158.n;
          iVar6 = mustache_buffer_insert(&local_d8,local_d8.n,&local_138,8);
          if ((iVar6 == 0) &&
             (iVar6 = mustache_compile_tagname
                                (&local_158,templ_data + *(long *)(piVar21 + 10),
                                 *(long *)(piVar21 + 0xc) - *(long *)(piVar21 + 10)), iVar6 == 0)) {
            local_130[7] = 8;
            goto LAB_00108497;
          }
        }
        goto LAB_0010868a;
      case 8:
        local_130[7] = 7;
        iVar6 = mustache_buffer_insert(&local_158,local_158.n,local_130 + 7,1);
        sVar20 = local_d8.n;
        puVar5 = local_d8.data;
        if (iVar6 == 0) {
          lVar23 = local_d8.n - 8;
          local_d8.n = local_d8.n - 8;
          iVar6 = mustache_buffer_insert_num
                            (&local_158,local_158.n,local_158.n - *(long *)(local_d8.data + lVar23))
          ;
          if (iVar6 == 0) {
            uVar22 = *(ulong *)(puVar5 + (sVar20 - 0x10));
            local_d8.n = sVar20 - 0x10;
            goto LAB_001084ca;
          }
        }
        goto LAB_0010868a;
      case 9:
        uVar22 = *(ulong *)(local_d8.data + (local_d8.n - 8));
        local_d8.n = local_d8.n - 8;
LAB_001084ca:
        num = local_158.n - uVar22;
LAB_001084d2:
        iVar6 = mustache_buffer_insert_num(&local_158,uVar22,num);
        goto LAB_0010865a;
      case 10:
        local_130[7] = 9;
        iVar6 = mustache_buffer_insert(&local_158,local_158.n,local_130 + 7,1);
        if (((iVar6 != 0) ||
            (iVar6 = mustache_buffer_insert_num
                               (&local_158,local_158.n,
                                *(long *)(piVar21 + 0xc) - *(long *)(piVar21 + 10)), iVar6 != 0)) ||
           (iVar6 = mustache_buffer_insert
                              (&local_158,local_158.n,templ_data + *(long *)(piVar21 + 10),
                               *(long *)(piVar21 + 0xc) - *(long *)(piVar21 + 10)), iVar6 != 0))
        goto LAB_0010868a;
        sVar20 = 0;
        while (((ulong)(byte)templ_data[sVar20 + *(long *)(piVar21 + 6)] < 0x21 &&
               ((0x100001a00U >> ((ulong)(byte)templ_data[sVar20 + *(long *)(piVar21 + 6)] & 0x3f) &
                1) != 0))) {
          sVar20 = sVar20 + 1;
        }
        iVar6 = mustache_buffer_insert_num(&local_158,local_158.n,sVar20);
        if (iVar6 != 0) goto LAB_0010868a;
        data = (ulong *)(templ_data + *(long *)(piVar21 + 6));
        sVar9 = local_158.n;
        break;
      case 0xb:
        local_130[7] = 10;
LAB_00108497:
        sVar20 = 1;
        data = (ulong *)(local_130 + 7);
        sVar9 = local_158.n;
      }
      iVar6 = mustache_buffer_insert(pMVar17,sVar9,data,sVar20);
LAB_0010865a:
      if (iVar6 != 0) break;
switchD_00108341_caseD_1:
      lVar23 = *(long *)(piVar21 + 8);
      piVar21 = piVar21 + 0xe;
    } while( true );
  }
LAB_0010868a:
  free(local_190);
  free(local_d8.data);
  free(local_158.data);
  return (MUSTACHE_TEMPLATE *)0x0;
}

Assistant:

MUSTACHE_TEMPLATE*
mustache_compile(const char* templ_data, size_t templ_size,
                 const MUSTACHE_PARSER* parser, void* parser_data,
                 unsigned flags)
{
    static const MUSTACHE_PARSER default_parser = { mustache_parse_error };
    MUSTACHE_TAGINFO* tags = NULL;
    unsigned n_tags;
    off_t off;
    off_t jmp_pos;
    MUSTACHE_TAGINFO* tag;
    MUSTACHE_BUFFER insns = { 0 };
    MUSTACHE_STACK jmp_pos_stack = { 0 };
    int done = 0;
    int success = 0;
    size_t indent_len;

    if(parser == NULL)
        parser = &default_parser;

    /* Collect all tags from the template. */
    if(mustache_parse(templ_data, templ_size, parser, parser_data, &tags, &n_tags) != 0)
        goto err;

    /* Build the template */
#define APPEND(data, n)                                                                 \
        do {                                                                            \
            if(mustache_buffer_append(&insns, (data), (n)) != 0)                        \
                goto err;                                                               \
        } while(0)

#define APPEND_NUM(num)                                                                 \
        do {                                                                            \
            if(mustache_buffer_append_num(&insns, (uint64_t)(num)) != 0)                \
                goto err;                                                               \
        } while(0)

#define APPEND_TAGNAME(tag)                                                             \
        do {                                                                            \
            if(mustache_compile_tagname(&insns, templ_data + (tag)->name_beg,           \
                                        (tag)->name_end - (tag)->name_beg) != 0)        \
                goto err;                                                               \
        } while(0)

#define INSERT_NUM(pos, num)                                                            \
        do {                                                                            \
            if(mustache_buffer_insert_num(&insns, (pos), (uint64_t)(num)) != 0)         \
                goto err;                                                               \
        } while(0)

#define PUSH_JMP_POS()                                                                  \
        do {                                                                            \
            if(mustache_stack_push(&jmp_pos_stack, insns.n) != 0)                       \
                goto err;                                                               \
        } while(0)

#define POP_JMP_POS()       ((off_t) mustache_stack_pop(&jmp_pos_stack))

    off = 0;
    tag = &tags[0];
    while(1) {
        if(off < tag->beg) {
            /* Handle literal text before the next tag. */
            APPEND_NUM(MUSTACHE_OP_LITERAL);
            APPEND_NUM(tag->beg - off);
            APPEND(templ_data + off, tag->beg - off);
            off = tag->beg;
        }

        switch(tag->type) {
        case MUSTACHE_TAGTYPE_VAR:
        case MUSTACHE_TAGTYPE_VERBATIMVAR:
        case MUSTACHE_TAGTYPE_VERBATIMVAR2:
            APPEND_NUM(MUSTACHE_OP_RESOLVE);
            APPEND_TAGNAME(tag);
            APPEND_NUM((tag->type == MUSTACHE_TAGTYPE_VAR) ?
                        MUSTACHE_OP_OUTESCAPED : MUSTACHE_OP_OUTVERBATIM);
            break;

        case MUSTACHE_TAGTYPE_OPENSECTION:
            APPEND_NUM(MUSTACHE_OP_RESOLVE_setjmp);
            PUSH_JMP_POS();
            APPEND_TAGNAME(tag);
            APPEND_NUM(MUSTACHE_OP_ENTER);
            PUSH_JMP_POS();
            break;

        case MUSTACHE_TAGTYPE_CLOSESECTION:
            APPEND_NUM(MUSTACHE_OP_LEAVE);
            APPEND_NUM(insns.n - POP_JMP_POS());
            jmp_pos = POP_JMP_POS();
            INSERT_NUM(jmp_pos, insns.n - jmp_pos);
            break;

        case MUSTACHE_TAGTYPE_OPENSECTIONINV:
            APPEND_NUM(MUSTACHE_OP_RESOLVE_setjmp);
            PUSH_JMP_POS();
            APPEND_TAGNAME(tag);
            APPEND_NUM(MUSTACHE_OP_ENTERINV);
            break;

        case MUSTACHE_TAGTYPE_CLOSESECTIONINV:
            jmp_pos = POP_JMP_POS();
            INSERT_NUM(jmp_pos, insns.n - jmp_pos);
            break;

        case MUSTACHE_TAGTYPE_PARTIAL:
            APPEND_NUM(MUSTACHE_OP_PARTIAL);
            APPEND_NUM(tag->name_end - tag->name_beg);
            APPEND(templ_data + tag->name_beg, tag->name_end - tag->name_beg);
            indent_len = 0;
            while(MUSTACHE_ISWHITESPACE(templ_data[tag->beg + indent_len]))
                indent_len++;
            APPEND_NUM(indent_len);
            APPEND(templ_data + tag->beg, indent_len);
            break;

        case MUSTACHE_TAGTYPE_INDENT:
            APPEND_NUM(MUSTACHE_OP_INDENT);
            break;

        case MUSTACHE_TAGTYPE_NONE:
            APPEND_NUM(MUSTACHE_OP_EXIT);
            done = 1;
            break;

        default:
            break;
        }

        if(done)
            break;

        off = tag->end;
        tag++;
    }

    success = 1;

err:
    free(tags);
    mustache_buffer_free(&jmp_pos_stack);
    if(success) {
        return (MUSTACHE_TEMPLATE*) insns.data;
    } else {
        mustache_buffer_free(&insns);
        return NULL;
    }
}